

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

bool __thiscall CLI::App::_process_config_file(App *this,string *config_file,bool throw_error)

{
  path_type pVar1;
  undefined8 uVar2;
  undefined1 in_DL;
  FileError *anon_var_0;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> values;
  path_type path_result;
  string *in_stack_000001d0;
  Config *in_stack_000001d8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_> *in_stack_ffffffffffffffd8;
  undefined3 in_stack_ffffffffffffffe4;
  uint uVar3;
  bool local_1;
  
  uVar3 = CONCAT13(in_DL,in_stack_ffffffffffffffe4) & 0x1ffffff;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1dfc3d);
  pVar1 = CLI::detail::check_path(in_stack_ffffffffffffffc8);
  if (pVar1 == file) {
    std::__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<CLI::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x1dfc65);
    Config::from_file(in_stack_000001d8,in_stack_000001d0);
    _parse_config((App *)CONCAT44(uVar3,pVar1),in_stack_ffffffffffffffd8);
    local_1 = true;
    std::vector<CLI::ConfigItem,_std::allocator<CLI::ConfigItem>_>::~vector
              (in_stack_ffffffffffffff90);
  }
  else {
    if ((uVar3 & 0x1000000) != 0) {
      uVar2 = __cxa_allocate_exception(0x38);
      ::std::__cxx11::string::string(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
      FileError::Missing(in_stack_ffffffffffffffb8);
      __cxa_throw(uVar2,&FileError::typeinfo,FileError::~FileError);
    }
    local_1 = false;
  }
  return local_1;
}

Assistant:

CLI11_INLINE bool App::_process_config_file(const std::string &config_file, bool throw_error) {
    auto path_result = detail::check_path(config_file.c_str());
    if(path_result == detail::path_type::file) {
        try {
            std::vector<ConfigItem> values = config_formatter_->from_file(config_file);
            _parse_config(values);
            return true;
        } catch(const FileError &) {
            if(throw_error) {
                throw;
            }
            return false;
        }
    } else if(throw_error) {
        throw FileError::Missing(config_file);
    } else {
        return false;
    }
}